

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

secplane_t * P_CheckSlopeWalk(AActor *actor,DVector2 *move)

{
  double dVar1;
  uint uVar2;
  extsector_t *peVar3;
  F3DFloor **ppFVar4;
  long lVar5;
  double *pdVar6;
  msecnode_t *pmVar7;
  sector_t_conflict *sec;
  double dVar8;
  double dVar9;
  int iVar10;
  secplane_t *psVar11;
  msecnode_t **ppmVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  DVector3 pos;
  double local_80;
  secplane_t *local_78;
  DVector3 local_68;
  DVector3 local_48;
  
  if ((P_CheckSlopeWalk(AActor*,TVector2<double>&)::copyplane == '\0') &&
     (iVar10 = __cxa_guard_acquire(&P_CheckSlopeWalk(AActor*,TVector2<double>&)::copyplane),
     iVar10 != 0)) {
    __cxa_guard_release(&P_CheckSlopeWalk(AActor*,TVector2<double>&)::copyplane);
  }
  if (((actor->flags).Value & 0x200) == 0) {
    AActor::PosRelative(&local_48,actor,actor->floorsector);
    local_78 = &actor->floorsector->floorplane;
    local_68.X = local_48.X;
    local_68.Y = local_48.Y;
    local_80 = secplane_t::ZatPoint(local_78,(DVector2 *)&local_68);
    peVar3 = actor->floorsector->e;
    ppFVar4 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
    uVar2 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    for (lVar13 = 0; (ulong)uVar2 << 3 != lVar13; lVar13 = lVar13 + 8) {
      lVar5 = *(long *)((long)ppFVar4 + lVar13);
      if ((~*(uint *)(lVar5 + 0x58) & 3) == 0) {
        local_68.X = local_48.X;
        local_68.Y = local_48.Y;
        dVar14 = secplane_t::ZatPoint(*(secplane_t **)(lVar5 + 0x28),(DVector2 *)&local_68);
        if ((local_80 < dVar14) && (dVar14 <= (actor->__Pos).Z + actor->MaxStepHeight)) {
          pdVar6 = *(double **)(lVar5 + 0x28);
          P_CheckSlopeWalk::copyplane.normal.Z = pdVar6[2];
          P_CheckSlopeWalk::copyplane.normal.X = *pdVar6;
          P_CheckSlopeWalk::copyplane.normal.Y = pdVar6[1];
          P_CheckSlopeWalk::copyplane.D = pdVar6[3];
          P_CheckSlopeWalk::copyplane.negiC = pdVar6[4];
          local_80 = dVar14;
          if (0.0 <= P_CheckSlopeWalk::copyplane.normal.Z) {
            local_78 = &P_CheckSlopeWalk::copyplane;
          }
          else {
            secplane_t::FlipVert(&P_CheckSlopeWalk::copyplane);
            local_78 = &P_CheckSlopeWalk::copyplane;
          }
        }
      }
    }
    psVar11 = local_78;
    if (actor->floorsector != actor->Sector) {
      peVar3 = actor->Sector->e;
      ppFVar4 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
      uVar2 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      for (lVar13 = 0; (ulong)uVar2 << 3 != lVar13; lVar13 = lVar13 + 8) {
        lVar5 = *(long *)((long)ppFVar4 + lVar13);
        if ((((~*(uint *)(lVar5 + 0x58) & 3) == 0) &&
            (dVar14 = secplane_t::ZatPoint(*(secplane_t **)(lVar5 + 0x28),actor), local_80 < dVar14)
            ) && (dVar14 <= (actor->__Pos).Z + actor->MaxStepHeight)) {
          pdVar6 = *(double **)(lVar5 + 0x28);
          P_CheckSlopeWalk::copyplane.normal.Z = pdVar6[2];
          P_CheckSlopeWalk::copyplane.normal.X = *pdVar6;
          P_CheckSlopeWalk::copyplane.normal.Y = pdVar6[1];
          P_CheckSlopeWalk::copyplane.D = pdVar6[3];
          P_CheckSlopeWalk::copyplane.negiC = pdVar6[4];
          if (P_CheckSlopeWalk::copyplane.normal.Z < 0.0) {
            secplane_t::FlipVert(&P_CheckSlopeWalk::copyplane);
          }
          local_78 = &P_CheckSlopeWalk::copyplane;
          local_80 = dVar14;
        }
      }
      psVar11 = local_78;
      if ((actor->floorsector != actor->Sector) &&
         (psVar11 = (secplane_t *)0x0, actor->floorz + 4.0 < local_80)) {
        return (secplane_t *)0x0;
      }
    }
    dVar14 = (actor->__Pos).Z;
    local_80 = dVar14 - local_80;
    if (local_80 <= 1.0) {
      dVar15 = (local_78->normal).X;
      dVar16 = (local_78->normal).Y;
      if (((dVar15 != 0.0) || (NAN(dVar15))) || ((dVar16 != 0.0 || (NAN(dVar16))))) {
        dVar8 = (actor->__Pos).X;
        dVar9 = (actor->__Pos).Y;
        dVar17 = move->X + dVar8;
        dVar18 = move->Y + dVar9;
        dVar1 = (local_78->normal).Z;
        dVar14 = dVar14 * dVar1 + dVar16 * dVar18 + dVar15 * dVar17 + local_78->D;
        if (0.0 <= dVar14) {
          if (1.52587890625e-05 <= ABS(local_80)) {
            return (secplane_t *)0x0;
          }
          if (dVar14 <= 0.0) {
            return (secplane_t *)0x0;
          }
          dVar17 = dVar17 + dVar15 * dVar14;
          dVar18 = dVar18 + dVar16 * dVar14;
        }
        else {
          if (dVar1 < 0.707122802734375) {
            if (((actor->flags).Value & 0x1000) != 0) {
              return psVar11;
            }
            if (0.4714152018229167 < dVar1) {
              ppmVar12 = &actor->touching_sectorlist;
              while (pmVar7 = *ppmVar12, pmVar7 != (msecnode_t *)0x0) {
                sec = pmVar7->m_sector;
                if (0.707122802734375 <= (sec->floorplane).normal.Z) {
                  AActor::PosRelative(&local_68,actor,(sector_t *)sec);
                  local_68.X = move->X + local_68.X;
                  local_68.Y = move->Y + local_68.Y;
                  dVar14 = secplane_t::ZatPoint(&sec->floorplane,(DVector2 *)&local_68);
                  if ((actor->__Pos).Z - actor->MaxStepHeight <= dVar14) goto LAB_0041814d;
                }
                ppmVar12 = &pmVar7->m_tnext;
              }
              dVar15 = (local_78->normal).X;
              dVar16 = (local_78->normal).Y;
            }
            move->X = dVar15 + dVar15;
            move->Y = dVar16 + dVar16;
            (actor->Vel).X = dVar15 + dVar15;
            (actor->Vel).Y = dVar16 + dVar16;
LAB_0041814d:
            if (actor->floorsector != actor->Sector) {
              return (secplane_t *)0x0;
            }
            return local_78;
          }
          dVar17 = dVar17 - dVar15 * dVar14;
          dVar18 = dVar18 - dVar16 * dVar14;
        }
        move->X = dVar17 - dVar8;
        move->Y = dVar18 - dVar9;
        return psVar11;
      }
    }
  }
  return (secplane_t *)0x0;
}

Assistant:

const secplane_t * P_CheckSlopeWalk(AActor *actor, DVector2 &move)
{
	static secplane_t copyplane;
	if (actor->flags & MF_NOGRAVITY)
	{
		return NULL;
	}

	DVector3 pos = actor->PosRelative(actor->floorsector);
	const secplane_t *plane = &actor->floorsector->floorplane;
	double planezhere = plane->ZatPoint(pos);

	for (auto rover : actor->floorsector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

		double thisplanez = rover->top.plane->ZatPoint(pos);

		if (thisplanez > planezhere && thisplanez <= actor->Z() + actor->MaxStepHeight)
		{
			copyplane = *rover->top.plane;
			if (copyplane.fC() < 0) copyplane.FlipVert();
			plane = &copyplane;
			planezhere = thisplanez;
		}
	}

	if (actor->floorsector != actor->Sector)
	{
		for (auto rover : actor->Sector->e->XFloor.ffloors)
		{
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double thisplanez = rover->top.plane->ZatPoint(actor);

			if (thisplanez > planezhere && thisplanez <= actor->Z() + actor->MaxStepHeight)
			{
				copyplane = *rover->top.plane;
				if (copyplane.fC() < 0) copyplane.FlipVert();
				plane = &copyplane;
				planezhere = thisplanez;
			}
		}
	}

	if (actor->floorsector != actor->Sector)
	{
		// this additional check prevents sliding on sloped dropoffs
		if (planezhere>actor->floorz + 4)
			return NULL;
	}

	if (actor->Z() - planezhere > 1)
	{ // not on floor
		return NULL;
	}

	if (plane->isSlope())
	{
		DVector2 dest;
		double t;

		dest = actor->Pos() + move;
		t = (plane->Normal() | DVector3(dest, actor->Z())) + plane->fD();
		if (t < 0)
		{ // Desired location is behind (below) the plane
			// (i.e. Walking up the plane)
			if (plane->fC() < STEEPSLOPE)
			{ // Can't climb up slopes of ~45 degrees or more
				if (actor->flags & MF_NOCLIP)
				{
					return (actor->floorsector == actor->Sector) ? plane : NULL;
				}
				else
				{
					const msecnode_t *node;
					bool dopush = true;

					if (plane->fC() > STEEPSLOPE * 2 / 3)
					{
						for (node = actor->touching_sectorlist; node; node = node->m_tnext)
						{
							sector_t *sec = node->m_sector;
							if (sec->floorplane.fC() >= STEEPSLOPE)
							{
								DVector3 pos = actor->PosRelative(sec) +move;

								if (sec->floorplane.ZatPoint(pos) >= actor->Z() - actor->MaxStepHeight)
								{
									dopush = false;
									break;
								}
							}
						}
					}
					if (dopush)
					{
						move = plane->Normal() * 2;
						actor->Vel.X = move.X;
						actor->Vel.Y = move.Y;
					}
					return (actor->floorsector == actor->Sector) ? plane : NULL;
				}
			}
			// Slide the desired location along the plane's normal
			// so that it lies on the plane's surface
			dest -= plane->Normal() * t;
			move = dest - actor->Pos().XY();
			return (actor->floorsector == actor->Sector) ? plane : NULL;
		}
		else if (t > 0)
		{ // Desired location is in front of (above) the plane
			if (actor->isAtZ(planezhere))	// it is very important not to be too precise here.
			{ 
				// Actor's current spot is on/in the plane, so walk down it
				// Same principle as walking up, except reversed
				dest += plane->Normal() * t;
				move = dest - actor->Pos().XY();
				return (actor->floorsector == actor->Sector) ? plane : NULL;
			}
		}
	}
	return NULL;
}